

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadDataSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  void *local_68;
  void *data;
  Address data_size;
  Enum local_50;
  Enum local_4c;
  Enum local_48;
  Enum local_44;
  Index local_40;
  Enum local_3c;
  Index memory_index;
  uint local_34;
  uint32_t flags;
  Index i;
  Index local_28;
  Enum local_24;
  Index num_data_segments;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_data_segments = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x99])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (bVar1) {
    i = (Index)ReadCount(this,&local_28,"data segment count");
    bVar1 = Failed((Result)i);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      flags = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9a])();
      bVar1 = Succeeded((Result)flags);
      if (bVar1) {
        if ((this->data_count_ == 0xffffffff) || (this->data_count_ == local_28)) {
          for (local_34 = 0; local_34 < local_28; local_34 = local_34 + 1) {
            local_3c = (Enum)ReadU32Leb128(this,&memory_index,"data segment flags");
            bVar1 = Failed((Result)local_3c);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if ((memory_index != 0) &&
               (bVar1 = Features::bulk_memory_enabled(&this->options_->features), !bVar1)) {
              PrintError(this,"invalid memory index %d: bulk memory not allowed",(ulong)memory_index
                        );
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if (7 < memory_index) {
              PrintError(this,"invalid data segment flags: %#x",(ulong)memory_index);
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            local_40 = 0;
            if ((memory_index & 2) != 0) {
              local_44 = (Enum)ReadIndex(this,&local_40,"data segment memory index");
              bVar1 = Failed((Result)local_44);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            local_48 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9b])
                                 (this->delegate_,(ulong)local_34,(ulong)local_40,
                                  (ulong)(byte)memory_index);
            bVar1 = Succeeded((Result)local_48);
            if (!bVar1) {
              PrintError(this,"BeginDataSegment callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if ((memory_index & 1) == 0) {
              sVar3 = std::vector<wabt::Limits,_std::allocator<wabt::Limits>_>::size
                                (&this->memories);
              if (sVar3 == 0) {
                PrintError(this,"no memory to copy data to");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              local_4c = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9c])
                                   (this->delegate_,(ulong)local_34);
              bVar1 = Succeeded((Result)local_4c);
              if (!bVar1) {
                PrintError(this,"BeginDataSegmentInitExpr callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              local_50 = (Enum)ReadInitExpr(this,local_34);
              bVar1 = Failed((Result)local_50);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
              data_size._4_4_ =
                   (*this->delegate_->_vptr_BinaryReaderDelegate[0x9d])
                             (this->delegate_,(ulong)local_34);
              bVar1 = Succeeded(data_size._4_4_);
              if (!bVar1) {
                PrintError(this,"EndDataSegmentInitExpr callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                return (Result)this_local._4_4_;
              }
            }
            RVar2 = ReadBytes(this,&local_68,(Address *)&data,"data segment data");
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9e])
                                    (this->delegate_,(ulong)local_34,local_68,data);
            bVar1 = Succeeded(RVar2);
            if (!bVar1) {
              PrintError(this,"OnDataSegmentData callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9f])();
            bVar1 = Succeeded(RVar2);
            if (!bVar1) {
              PrintError(this,"EndDataSegment callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa0])();
          bVar1 = Succeeded(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
          else {
            PrintError(this,"EndDataSection callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
        }
        else {
          PrintError(this,"data segment count does not equal count in DataCount section");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnDataSegmentCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginDataSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadDataSection(Offset section_size) {
  CALLBACK(BeginDataSection, section_size);
  Index num_data_segments;
  CHECK_RESULT(ReadCount(&num_data_segments, "data segment count"));
  CALLBACK(OnDataSegmentCount, num_data_segments);
  // If the DataCount section is not present, then data_count_ will be invalid.
  ERROR_UNLESS(data_count_ == kInvalidIndex || data_count_ == num_data_segments,
               "data segment count does not equal count in DataCount section");
  for (Index i = 0; i < num_data_segments; ++i) {
    uint32_t flags;
    CHECK_RESULT(ReadU32Leb128(&flags, "data segment flags"));
    ERROR_IF(flags != 0 && !options_.features.bulk_memory_enabled(),
             "invalid memory index %d: bulk memory not allowed", flags);
    ERROR_IF(flags > SegFlagMax, "invalid data segment flags: %#x", flags);
    Index memory_index(0);
    if (flags & SegExplicitIndex) {
      CHECK_RESULT(ReadIndex(&memory_index, "data segment memory index"));
    }
    CALLBACK(BeginDataSegment, i, memory_index, flags);
    if (!(flags & SegPassive)) {
      ERROR_UNLESS(memories.size() > 0, "no memory to copy data to");
      CALLBACK(BeginDataSegmentInitExpr, i);
      CHECK_RESULT(ReadInitExpr(i));
      CALLBACK(EndDataSegmentInitExpr, i);
    }

    Address data_size;
    const void* data;
    CHECK_RESULT(ReadBytes(&data, &data_size, "data segment data"));
    CALLBACK(OnDataSegmentData, i, data, data_size);
    CALLBACK(EndDataSegment, i);
  }
  CALLBACK0(EndDataSection);
  return Result::Ok;
}